

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

_glist * canvas_new(void *dummy,t_symbol *sel,int argc,t_atom *argv)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  _instancecanvas *p_Var5;
  _glist *x;
  _glist *p_Var6;
  int *piVar7;
  _canvasenvironment *p_Var8;
  t_atom *ptVar9;
  _canvasenvironment **pp_Var10;
  _class *p_Var11;
  int iVar12;
  int iVar13;
  uint uVar14;
  t_symbol *ptVar15;
  t_float tVar16;
  int local_44;
  int local_40;
  int local_3c;
  
  x = (_glist *)pd_new(canvas_class);
  p_Var6 = (_glist *)pd_findbyclass(&s__X,canvas_class);
  if (p_Var6 == (_glist *)0x0) {
    piVar7 = &sys_defaultfont;
  }
  else {
    piVar7 = &p_Var6->gl_font;
  }
  local_3c = *piVar7;
  glist_init(x);
  (x->gl_obj).field_0x2e = ((x->gl_obj).field_0x2e & 0xfc) + 1;
  if (p_Var6 == (_glist *)0x0) {
    x->gl_next = pd_maininstance.pd_canvaslist;
    pd_maininstance.pd_canvaslist = x;
  }
  if (argc == 6) {
    tVar16 = atom_getfloatarg(0,6,argv);
    local_40 = (int)tVar16;
    tVar16 = atom_getfloatarg(1,6,argv);
    local_44 = (int)tVar16;
    tVar16 = atom_getfloatarg(2,6,argv);
    iVar12 = (int)tVar16;
    tVar16 = atom_getfloatarg(3,6,argv);
    iVar13 = (int)tVar16;
    ptVar15 = atom_getsymbolarg(4,6,argv);
    tVar16 = atom_getfloatarg(5,6,argv);
    uVar14 = (uint)tVar16;
  }
  else {
    ptVar15 = &s_;
    if (argc == 5) {
      uVar14 = 0;
      tVar16 = atom_getfloatarg(0,5,argv);
      local_40 = (int)tVar16;
      tVar16 = atom_getfloatarg(1,5,argv);
      local_44 = (int)tVar16;
      tVar16 = atom_getfloatarg(2,5,argv);
      iVar12 = (int)tVar16;
      tVar16 = atom_getfloatarg(3,5,argv);
      iVar13 = (int)tVar16;
      tVar16 = atom_getfloatarg(4,5,argv);
      local_3c = (int)tVar16;
    }
    else {
      local_44 = 0x32;
      iVar13 = 300;
      iVar12 = 0x1c2;
      uVar14 = 0;
      local_40 = 0;
    }
  }
  if (((pd_maininstance.pd_gui)->i_newdirectory == (t_symbol *)0x0) ||
     (*(pd_maininstance.pd_gui)->i_newdirectory->s_name == '\0')) {
    pp_Var10 = &x->gl_env;
  }
  else {
    p_Var8 = (_canvasenvironment *)getbytes(0x28);
    x->gl_env = p_Var8;
    if ((pd_maininstance.pd_gui)->i_newargv == (t_atom *)0x0) {
      ptVar9 = (t_atom *)getbytes(0);
      (pd_maininstance.pd_gui)->i_newargv = ptVar9;
    }
    p_Var5 = pd_maininstance.pd_gui;
    p_Var8->ce_dir = (pd_maininstance.pd_gui)->i_newdirectory;
    p_Var8->ce_argc = p_Var5->i_newargc;
    pp_Var10 = (_canvasenvironment **)&p_Var5->i_newargv;
    p_Var8->ce_argv = p_Var5->i_newargv;
    iVar1 = p_Var5->i_dollarzero;
    p_Var5->i_dollarzero = iVar1 + 1;
    p_Var8->ce_dollarzero = iVar1;
    p_Var8->ce_path = (t_namelist *)0x0;
    p_Var5->i_newdirectory = &s_;
    p_Var5->i_newargc = 0;
  }
  *pp_Var10 = (_canvasenvironment *)0x0;
  canvas_undo_init(x);
  x->gl_x1 = 0.0;
  x->gl_y1 = 0.0;
  x->gl_x2 = 1.0;
  x->gl_y2 = 1.0;
  canvas_dosetbounds(x,local_40,local_44,iVar12 + local_40,iVar13 + local_44);
  x->gl_owner = p_Var6;
  x->field_0xe9 = x->field_0xe9 & 0xf7;
  if ((*ptVar15->s_name == '\0') &&
     (ptVar15 = (pd_maininstance.pd_gui)->i_newfilename, ptVar15 == (t_symbol *)0x0)) {
    ptVar15 = gensym("Pd");
  }
  x->gl_name = ptVar15;
  canvas_bind(x);
  *(ushort *)&x->field_0xe8 = (ushort)*(undefined4 *)&x->field_0xe8 & 0xff77 | 8;
  if (uVar14 == 0) {
    uVar14 = 0;
  }
  else {
    ptVar15 = gensym("#X");
    if ((ptVar15->s_thing != (_class **)0x0) &&
       (ptVar15 = gensym("#X"), *ptVar15->s_thing == canvas_class)) {
      ptVar15 = gensym("#X");
      p_Var11 = (_class *)ptVar15->s_thing;
      do {
        if (p_Var11 == (_class *)0x0) goto LAB_001376bf;
        uVar4 = p_Var11 + 1;
        p_Var11 = (_class *)p_Var11->c_floatmethod;
      } while (*(_class **)(uVar4 + 0x40) == (_class *)0x0);
      if (p_Var11 != (_class *)0x0) {
        uVar14 = 0;
      }
    }
  }
LAB_001376bf:
  uVar3 = (ushort)*(undefined4 *)&x->field_0xe8;
  uVar2 = (ushort)((uVar14 & 1) << 4);
  *(ushort *)&x->field_0xe8 = uVar3 & 0xffef | uVar2;
  iVar12 = strncmp(x->gl_name->s_name,"PDUNTITLED",10);
  *(ushort *)&x->field_0xe8 = uVar3 & 0xffcf | uVar2 | (ushort)(iVar12 == 0) << 5;
  iVar12 = sys_nearestfontsize(local_3c);
  x->gl_font = iVar12;
  if (p_Var6 == (_glist *)0x0) {
    iVar12 = 1;
  }
  else {
    iVar12 = p_Var6->gl_zoom;
  }
  x->gl_zoom = iVar12;
  pd_pushsym((t_pd *)x);
  return x;
}

Assistant:

t_canvas *canvas_new(void *dummy, t_symbol *sel, int argc, t_atom *argv)
{
    t_canvas *x = (t_canvas *)pd_new(canvas_class);
    t_canvas *owner = canvas_getcurrent();
    t_symbol *s = &s_;
    int vis = 0, width = GLIST_DEFCANVASWIDTH, height = GLIST_DEFCANVASHEIGHT;
    int xloc = GLIST_DEFCANVASXLOC, yloc = GLIST_DEFCANVASYLOC;
    int font = (owner ? owner->gl_font : sys_defaultfont);
    glist_init(x);
    x->gl_obj.te_type = T_OBJECT;
    if (!owner)
        canvas_addtolist(x);
    /* post("canvas %lx, owner %lx", x, owner); */

    if (argc == 5)  /* toplevel: x, y, w, h, font */
    {
        xloc = atom_getfloatarg(0, argc, argv);
        yloc = atom_getfloatarg(1, argc, argv);
        width = atom_getfloatarg(2, argc, argv);
        height = atom_getfloatarg(3, argc, argv);
        font = atom_getfloatarg(4, argc, argv);
    }
    else if (argc == 6)  /* subwindow: x, y, w, h, name, vis */
    {
        xloc = atom_getfloatarg(0, argc, argv);
        yloc = atom_getfloatarg(1, argc, argv);
        width = atom_getfloatarg(2, argc, argv);
        height = atom_getfloatarg(3, argc, argv);
        s = atom_getsymbolarg(4, argc, argv);
        vis = atom_getfloatarg(5, argc, argv);
    }

        /* (otherwise assume we're being created from the menu.) */
    if (THISGUI->i_newdirectory &&
        THISGUI->i_newdirectory->s_name[0])
    {
        t_canvasenvironment *env = x->gl_env =
            (t_canvasenvironment *)getbytes(sizeof(*x->gl_env));
        if (!THISGUI->i_newargv)
            THISGUI->i_newargv = getbytes(0);
        env->ce_dir = THISGUI->i_newdirectory;
        env->ce_argc = THISGUI->i_newargc;
        env->ce_argv = THISGUI->i_newargv;
        env->ce_dollarzero = THISGUI->i_dollarzero++;
        env->ce_path = 0;
        THISGUI->i_newdirectory = &s_;
        THISGUI->i_newargc = 0;
        THISGUI->i_newargv = 0;
    }
    else x->gl_env = 0;

        /* initialize private data, like the undo-queue */
    canvas_undo_init(x);

    x->gl_x1 = 0;
    x->gl_y1 = 0;
    x->gl_x2 = 1;
    x->gl_y2 = 1;
    canvas_dosetbounds(x, xloc, yloc, xloc + width, yloc + height);
    x->gl_owner = owner;
    x->gl_isclone = 0;
    x->gl_name = (*s->s_name ? s :
        (THISGUI->i_newfilename ? THISGUI->i_newfilename : gensym("Pd")));
    canvas_bind(x);
    x->gl_loading = 1;
    x->gl_goprect = 0;      /* no GOP rectangle unless it's turned on later */
        /* cancel "vis" flag if we're a subpatch of an
         abstraction inside another patch.  A separate mechanism prevents
         the toplevel abstraction from showing up. */
    if (vis && gensym("#X")->s_thing &&
        ((*gensym("#X")->s_thing) == canvas_class))
    {
        t_canvas *zzz = (t_canvas *)(gensym("#X")->s_thing);
        while (zzz && !zzz->gl_env)
            zzz = zzz->gl_owner;
        if (zzz && canvas_isabstraction(zzz) && zzz->gl_owner)
            vis = 0;
    }
    x->gl_willvis = vis;
    x->gl_edit = !UNTITLED_STRNCMP(x->gl_name->s_name);
    x->gl_font = sys_nearestfontsize(font);
    x->gl_zoom = (owner ? owner->gl_zoom : 1);
    pd_pushsym(&x->gl_pd);
    return(x);
}